

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorProperty
          (FBXConverter *this,PropertyTable *props,string *colorName,bool *result,bool useTemplate)

{
  undefined7 in_register_00000081;
  bool in_R9B;
  aiColor3D aVar1;
  bool ok;
  bool local_19;
  
  *(undefined1 *)CONCAT71(in_register_00000081,useTemplate) = 1;
  aVar1 = (aiColor3D)
          PropertyGet<aiVector3t<float>>
                    ((PropertyTable *)colorName,(string *)result,&local_19,in_R9B);
  if (local_19 == false) {
    *(undefined1 *)CONCAT71(in_register_00000081,useTemplate) = 0;
    aVar1 = (aiColor3D)ZEXT412(0);
  }
  *(aiColor3D *)this = aVar1;
  return aVar1;
}

Assistant:

aiColor3D FBXConverter::GetColorProperty(const PropertyTable& props, const std::string& colorName,
            bool& result, bool useTemplate)
        {
            result = true;
            bool ok;
            const aiVector3D& ColorVec = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }
            return aiColor3D(ColorVec.x, ColorVec.y, ColorVec.z);
        }